

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O2

exr_result_t
uncompress_b44_impl(exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
                   void *uncompressed_data,uint64_t uncomp_buf_size)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  exr_coding_channel_info_t *peVar6;
  byte bVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  int i;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ushort uVar15;
  long lVar16;
  long lVar17;
  size_t sVar18;
  uint16_t *__src;
  uint uVar19;
  void *__dest;
  void *__dest_00;
  void *__dest_01;
  size_t __n;
  ulong uVar20;
  void *pvVar21;
  long lVar22;
  uint16_t s [16];
  void *local_b8;
  long local_a8;
  ulong local_a0;
  void *local_80;
  void *local_78;
  
  pvVar21 = decode->scratch_buffer_1;
  local_a0 = 0;
  for (lVar22 = 0; uVar13 = (ulong)decode->channel_count, lVar22 < (long)uVar13; lVar22 = lVar22 + 1
      ) {
    peVar6 = decode->channels;
    lVar16 = (long)peVar6[lVar22].width;
    lVar14 = (long)peVar6[lVar22].height;
    sVar18 = (long)peVar6[lVar22].bytes_per_element * lVar14 * lVar16;
    if (sVar18 != 0) {
      if (peVar6[lVar22].data_type == 1) {
        for (uVar13 = 0; (long)uVar13 < lVar14; uVar13 = uVar13 + 4) {
          __dest_01 = (void *)((long)pvVar21 + uVar13 * lVar16 * 2);
          local_b8 = (void *)((long)__dest_01 + lVar16 * 2);
          __dest_00 = (void *)((long)local_b8 + lVar16 * 2);
          local_78 = (void *)((long)__dest_00 + lVar16 * 2);
          for (uVar20 = 0; lVar16 - uVar20 != 0 && (long)uVar20 <= lVar16; uVar20 = uVar20 + 4) {
            if (comp_buf_size < local_a0 + 3) {
              return 1;
            }
            bVar1 = (byte)*(ushort *)((long)compressed_data + 2);
            if (bVar1 < 0x34) {
              local_a0 = local_a0 + 0xe;
              if (comp_buf_size < local_a0) {
                return 1;
              }
              s[0] = *compressed_data << 8 | *compressed_data >> 8;
              bVar7 = bVar1 >> 2;
              sVar10 = (short)(-0x20 << (bVar7 & 0x1f));
              sVar9 = s[0] + sVar10;
              s[4] = (short)(((bVar1 & 3) << 4 | (uint)(*(byte *)((long)compressed_data + 3) >> 4))
                            << (bVar7 & 0x1f)) + sVar9;
              iVar3 = (uint)(byte)((byte)*(ushort *)((long)compressed_data + 4) >> 6) +
                      (*(byte *)((long)compressed_data + 3) & 0xf) * 4;
              sVar8 = s[4] + sVar10;
              s[8] = (short)(iVar3 << (bVar7 & 0x1f)) + sVar8;
              s[0xc] = (short)(((byte)*(ushort *)((long)compressed_data + 4) & 0x3f) + iVar3 + -0x20
                              << (bVar7 & 0x1f)) + sVar8;
              s[1] = ((ushort)(*(byte *)((long)compressed_data + 5) >> 2) << (bVar7 & 0x1f)) + sVar9
              ;
              s[5] = (short)(((*(byte *)((long)compressed_data + 5) & 3) << 4 |
                             (uint)(byte)((byte)*(ushort *)((long)compressed_data + 6) >> 4)) <<
                            (bVar7 & 0x1f)) + sVar8;
              s[9] = (short)((uint)(*(byte *)((long)compressed_data + 7) >> 6) +
                             ((byte)*(ushort *)((long)compressed_data + 6) & 0xf) * 4 <<
                            (bVar7 & 0x1f)) + sVar10 + s[8];
              s[0xd] = (short)((*(byte *)((long)compressed_data + 7) & 0x3f) << (bVar7 & 0x1f)) +
                       sVar10 + s[0xc];
              s[2] = ((ushort)(byte)((byte)*(ushort *)((long)compressed_data + 8) >> 2) <<
                     (bVar7 & 0x1f)) + sVar10 + s[1];
              s[6] = (short)((((byte)*(ushort *)((long)compressed_data + 8) & 3) << 4 |
                             (uint)(*(byte *)((long)compressed_data + 9) >> 4)) << (bVar7 & 0x1f)) +
                     sVar10 + s[5];
              s[10] = (short)((uint)(byte)((byte)*(ushort *)((long)compressed_data + 10) >> 6) +
                              (*(byte *)((long)compressed_data + 9) & 0xf) * 4 << (bVar7 & 0x1f)) +
                      sVar10 + s[9];
              s[0xe] = (short)(((byte)*(ushort *)((long)compressed_data + 10) & 0x3f) <<
                              (bVar7 & 0x1f)) + sVar10 + s[0xd];
              s[3] = ((ushort)(*(byte *)((long)compressed_data + 0xb) >> 2) << (bVar7 & 0x1f)) +
                     sVar10 + s[2];
              s[7] = (short)(((*(byte *)((long)compressed_data + 0xb) & 3) << 4 |
                             (uint)(byte)((byte)*(ushort *)((long)compressed_data + 0xc) >> 4)) <<
                            (bVar7 & 0x1f)) + sVar10 + s[6];
              s[0xb] = (short)((uint)(*(byte *)((long)compressed_data + 0xd) >> 6) +
                               ((byte)*(ushort *)((long)compressed_data + 0xc) & 0xf) * 4 <<
                              (bVar7 & 0x1f)) + sVar10 + s[10];
              s[0xf] = (short)((*(byte *)((long)compressed_data + 0xd) & 0x3f) << (bVar7 & 0x1f)) +
                       sVar10 + s[0xe];
              for (uVar12 = (ulong)(uint)(0 << (bVar7 & 0x1f)); uVar12 != 0x10; uVar12 = uVar12 + 1)
              {
                uVar2 = s[uVar12];
                uVar15 = uVar2 & 0x7fff;
                if (-1 < (short)uVar2) {
                  uVar15 = ~uVar2;
                }
                s[uVar12] = uVar15;
              }
              local_a8 = 0xe;
            }
            else {
              uVar2 = (ushort)(byte)*compressed_data << 8;
              s[0] = (ushort)*(byte *)((long)compressed_data + 1) | uVar2 & 0x7fff;
              if (-1 < (short)uVar2) {
                s[0] = ~CONCAT11((byte)*compressed_data,*(byte *)((long)compressed_data + 1));
              }
              for (lVar17 = 1; lVar17 != 0x10; lVar17 = lVar17 + 1) {
                s[lVar17] = s[0];
              }
              local_a8 = 3;
              local_a0 = local_a0 + 3;
            }
            if (peVar6[lVar22].p_linear != '\0') {
              for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
                s[lVar17] = exrcore_logTable[s[lVar17]];
              }
            }
            __n = (lVar16 - uVar20) * 2;
            if ((long)(uVar20 | 3) < lVar16) {
              __n = 8;
            }
            memcpy(__dest_01,s,__n);
            if ((long)(uVar13 | 3) < lVar14) {
              memcpy(local_b8,s + 4,__n);
              memcpy(__dest_00,s + 8,__n);
              __src = s + 0xc;
              __dest = local_78;
LAB_00105d20:
              memcpy(__dest,__src,__n);
            }
            else {
              if ((long)(uVar13 | 1) < lVar14) {
                memcpy(local_b8,s + 4,__n);
              }
              if ((long)(uVar13 | 2) < lVar14) {
                __src = s + 8;
                __dest = __dest_00;
                goto LAB_00105d20;
              }
            }
            compressed_data = (void *)((long)compressed_data + local_a8);
            __dest_01 = (void *)((long)__dest_01 + 8);
            local_b8 = (void *)((long)local_b8 + 8);
            __dest_00 = (void *)((long)__dest_00 + 8);
            local_78 = (void *)((long)local_78 + 8);
          }
        }
      }
      else {
        local_a0 = local_a0 + sVar18;
        if (comp_buf_size < local_a0) {
          return 1;
        }
        memcpy(pvVar21,compressed_data,sVar18);
        compressed_data = (void *)((long)compressed_data + sVar18);
      }
      pvVar21 = (void *)((long)pvVar21 + sVar18);
    }
  }
  uVar20 = 0;
  local_80 = uncompressed_data;
  for (uVar19 = 0; iVar3 = (decode->chunk).height, (int)uVar19 < iVar3; uVar19 = uVar19 + 1) {
    iVar4 = (decode->chunk).start_y;
    pvVar21 = decode->scratch_buffer_1;
    lVar22 = 0x19;
    for (lVar14 = 0; lVar14 < (short)uVar13; lVar14 = lVar14 + 1) {
      peVar6 = decode->channels;
      sVar18 = (long)*(char *)((long)&peVar6->channel_name + lVar22) *
               (long)*(int *)((long)peVar6 + lVar22 + -0xd);
      lVar16 = (long)*(int *)((long)peVar6 + lVar22 + -0x11) * sVar18;
      if (lVar16 != 0) {
        uVar5 = *(uint *)((long)peVar6 + lVar22 + -5);
        uVar11 = uVar19;
        if (1 < (int)uVar5) {
          if ((int)(iVar4 + uVar19) % (int)uVar5 != 0) {
            pvVar21 = (void *)((long)pvVar21 + lVar16);
            goto LAB_00105e87;
          }
          uVar11 = uVar19 / uVar5;
        }
        uVar20 = uVar20 + sVar18;
        if (uncomp_buf_size < uVar20) goto LAB_00105e9a;
        memcpy(local_80,(void *)(uVar11 * sVar18 + (long)pvVar21),sVar18);
        local_80 = (void *)((long)local_80 + sVar18);
        pvVar21 = (void *)((long)pvVar21 + lVar16);
        uVar13 = (ulong)(ushort)decode->channel_count;
      }
LAB_00105e87:
      lVar22 = lVar22 + 0x30;
    }
  }
LAB_00105e9a:
  return (uint)((int)uVar19 < iVar3);
}

Assistant:

static exr_result_t
uncompress_b44_impl (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncomp_buf_size)
{
    const uint8_t* in      = (const uint8_t*) compressed_data;
    uint8_t*       out     = (uint8_t*) uncompressed_data;
    uint8_t*       scratch = (uint8_t*) decode->scratch_buffer_1;
    uint8_t*       tmp;
    uint16_t *     row0, *row1, *row2, *row3;
    uint64_t       n, nBytes, bpl = 0, bIn = 0;
    int            nx, ny;
    uint16_t       s[16];

    for (int c = 0; c < decode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* curc = decode->channels + c;
        nx                                    = curc->width;
        ny                                    = curc->height;
        nBytes = (uint64_t) (ny) * (uint64_t) (nx) *
                 (uint64_t) (curc->bytes_per_element);

        if (nBytes == 0) continue;

        if (curc->data_type != EXR_PIXEL_HALF)
        {
            if (bIn + nBytes > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;
            memcpy (scratch, in, nBytes);
            in += nBytes;
            bIn += nBytes;
            scratch += nBytes;
            continue;
        }

        for (int y = 0; y < ny; y += 4)
        {
            row0 = (uint16_t*) scratch;
            row0 += y * nx;
            row1 = row0 + nx;
            row2 = row1 + nx;
            row3 = row2 + nx;
            for (int x = 0; x < nx; x += 4)
            {
                if (bIn + 3 > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;

                /* check if 3-byte encoded flat field */
                if (in[2] >= (13 << 2))
                {
                    unpack3 (in, s);
                    in += 3;
                    bIn += 3;
                }
                else
                {
                    if (bIn + 14 > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;
                    unpack14 (in, s);
                    in += 14;
                    bIn += 14;
                }

                if (curc->p_linear) convertToLinear (s);

                priv_from_native16 (s, 16);

                n = (x + 3 < nx) ? 4 * sizeof (uint16_t)
                                 : (uint64_t) (nx - x) * sizeof (uint16_t);
                if (y + 3 < ny)
                {
                    memcpy (row0, &s[0], n);
                    memcpy (row1, &s[4], n);
                    memcpy (row2, &s[8], n);
                    memcpy (row3, &s[12], n);
                }
                else
                {
                    memcpy (row0, &s[0], n);
                    if (y + 1 < ny) memcpy (row1, &s[4], n);
                    if (y + 2 < ny) memcpy (row2, &s[8], n);
                }
                row0 += 4;
                row1 += 4;
                row2 += 4;
                row3 += 4;
            }
        }
        scratch += nBytes;
    }

    /* now put it back so each scanline has channel data */
    bIn = 0;
    for (int y = 0; y < decode->chunk.height; ++y)
    {
        int cury = y + decode->chunk.start_y;

        scratch = (uint8_t*) decode->scratch_buffer_1;
        for (int c = 0; c < decode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = decode->channels + c;

            nx     = curc->width;
            ny     = curc->height;
            bpl    = ((uint64_t) (nx)) * (uint64_t) (curc->bytes_per_element);
            nBytes = ((uint64_t) (ny)) * bpl;

            if (nBytes == 0) continue;

            tmp = scratch;
            if (curc->y_samples > 1)
            {
                if ((cury % curc->y_samples) != 0)
                {
                    scratch += nBytes;
                    continue;
                }
                tmp += ((uint64_t) (y / curc->y_samples)) * bpl;
            }
            else
                tmp += ((uint64_t) y) * bpl;

            if (bIn + bpl > uncomp_buf_size) return EXR_ERR_OUT_OF_MEMORY;

            memcpy (out, tmp, bpl);

            bIn += bpl;
            out += bpl;
            scratch += nBytes;
        }
    }

    return EXR_ERR_SUCCESS;
}